

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

HitTmp __thiscall BasicContainer::treehit(BasicContainer *this,Ray *ray,treenode *node)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  byte bVar4;
  Ray *in_RDX;
  BasicContainer *in_RSI;
  HitTmp HVar5;
  HitTmp resr;
  HitTmp resl;
  bool t;
  float p;
  HitTmp *local_98;
  BasicPrimitive *local_90;
  HitTmp local_70 [2];
  BasicPrimitive *local_50;
  float local_48;
  HitTmp local_40;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  HitTmp local_10;
  
  if (in_RDX == (Ray *)0x0) {
    HitTmp::HitTmp(&local_10);
  }
  else {
    bVar3 = AABox::intersect((AABox *)(in_RDX + 1),(Ray *)in_RSI);
    if (bVar3) {
      lVar1._0_4_ = (in_RDX->dir).y;
      lVar1._4_4_ = (in_RDX->dir).z;
      if (lVar1 == 0) {
        HVar5 = treehit(in_RSI,in_RDX,
                        (treenode *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        local_50 = HVar5.primitive;
        local_48 = HVar5.t;
        local_40.primitive = local_50;
        local_40.t = local_48;
        bVar3 = HitTmp::operator_cast_to_bool(&local_40);
        if (bVar3) {
          HVar5 = treehit(in_RSI,in_RDX,
                          (treenode *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
          ;
          local_70[0].primitive = HVar5.primitive;
          local_70[0].t = HVar5.t;
          bVar3 = HitTmp::operator_cast_to_bool(local_70);
          if ((!bVar3) || (local_40.t < local_70[0].t)) {
            local_98 = &local_40;
          }
          else {
            local_98 = local_70;
          }
          local_10.primitive = local_98->primitive;
          local_10.t = (float)*(undefined8 *)&local_98->t;
        }
        else {
          HVar5 = treehit(in_RSI,in_RDX,
                          (treenode *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
          ;
          local_10.primitive = HVar5.primitive;
          local_10.t = HVar5.t;
        }
      }
      else {
        plVar2 = *(long **)&(in_RDX->dir).y;
        bVar4 = (**(code **)(*plVar2 + 0x18))(plVar2,in_RSI,&stack0xffffffffffffffd4);
        if ((bVar4 & 1) == 0) {
          local_90 = (BasicPrimitive *)0x0;
        }
        else {
          local_90 = *(BasicPrimitive **)&(in_RDX->dir).y;
        }
        HitTmp::HitTmp(&local_10,local_90,in_stack_ffffffffffffffd4);
      }
    }
    else {
      HitTmp::HitTmp(&local_10);
    }
  }
  HVar5.t = local_10.t;
  HVar5.primitive = local_10.primitive;
  HVar5._12_4_ = 0;
  return HVar5;
}

Assistant:

HitTmp treehit(const Ray& ray, treenode* node) const {
		if (node == NULL) return HitTmp();
		if (!node->bound.intersect(ray)) return HitTmp();
		if (node->shape != NULL) {
			float p;
			bool t = node->shape->intersect(ray, p);
			return HitTmp(t? node->shape: NULL, p);
		}
		HitTmp resl = treehit(ray, node->lc);
		if (!resl) return treehit(ray, node->rc);
		HitTmp resr = treehit(ray, node->rc);
		return (!resr || resl.t < resr.t)? resl: resr;
	}